

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

QRect __thiscall QLineEditPrivate::adjustedControlRect(QLineEditPrivate *this,QRect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QRect QVar13;
  undefined8 local_48;
  QFontMetrics local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = rect->x1;
  uVar3 = rect->y1;
  uVar2 = rect->x2;
  uVar4 = rect->y2;
  auVar12._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
  auVar12._4_4_ = auVar12._0_4_;
  auVar12._8_4_ = -(uint)((int)uVar4 < (int)uVar3);
  auVar12._12_4_ = -(uint)((int)uVar4 < (int)uVar3);
  uVar8._4_4_ = movmskpd((int)local_38,auVar12);
  if (uVar8._4_4_ == 0) {
    uVar8._0_4_ = rect->x1;
    uVar8._4_4_ = (rect->y1).m_i;
    uVar10._0_4_ = rect->x2;
    uVar10._4_4_ = rect->y2;
    local_48 = uVar8;
  }
  else {
    lVar7 = *(long *)(*(long *)&(this->super_QWidgetPrivate).field_0x8 + 0x20);
    uVar10 = CONCAT44(*(int *)(lVar7 + 0x20) - *(int *)(lVar7 + 0x18),
                      *(int *)(lVar7 + 0x1c) - *(int *)(lVar7 + 0x14));
    local_48 = 0;
    uVar8._4_4_ = 0;
  }
  QVar13 = adjustedContentsRect(this);
  iVar11 = QVar13.x1.m_i.m_i - this->hscroll;
  iVar5 = this->vscroll;
  iVar6 = this->control->m_ascent;
  QFontMetrics::QFontMetrics
            (local_40,(QFont *)(*(long *)(*(long *)&(this->super_QWidgetPrivate).field_0x8 + 0x20) +
                               0x38));
  iVar9 = QFontMetrics::ascent();
  QFontMetrics::~QFontMetrics(local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar9 = iVar9 + (iVar5 - iVar6);
    QVar13.x1.m_i = (int)local_48 + iVar11 + 2;
    QVar13.x2.m_i = iVar11 + (int)uVar10 + 2;
    QVar13.y1.m_i = uVar8._4_4_ + iVar9;
    QVar13.y2.m_i = (int)((ulong)uVar10 >> 0x20) + iVar9;
    return QVar13;
  }
  __stack_chk_fail();
}

Assistant:

QRect QLineEditPrivate::adjustedControlRect(const QRect &rect) const
{
    QRect widgetRect = !rect.isEmpty() ? rect : q_func()->rect();
    QRect cr = adjustedContentsRect();
    int cix = cr.x() - hscroll + horizontalMargin;
    return widgetRect.translated(QPoint(cix, vscroll - control->ascent() + q_func()->fontMetrics().ascent()));
}